

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_insert_sync_reset_Test::TestBody(pass_insert_sync_reset_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __node_base var;
  __node_base _Var2;
  __node_base _Var3;
  bool bVar4;
  Generator *pGVar5;
  Port *pPVar6;
  element_type *peVar7;
  Var *pVVar8;
  element_type *peVar9;
  element_type *peVar10;
  Const *right;
  element_type *peVar11;
  char *pcVar12;
  mapped_type *pmVar13;
  long lVar14;
  Generator *top;
  char *in_R9;
  string local_bf8;
  AssertHelper local_bd8;
  Message local_bd0;
  bool local_bc1;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar__6;
  key_type local_ba8;
  string local_b88 [8];
  mapped_type src_child2;
  AssertHelper local_b48;
  Message local_b40;
  bool local_b31;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar__5;
  key_type local_b18;
  string local_af8 [8];
  mapped_type src_child;
  AssertHelper local_ab8;
  Message local_ab0;
  bool local_aa1;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_a70;
  Message local_a68;
  bool local_a59;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar__3;
  key_type local_a40;
  string local_a20 [8];
  mapped_type src_parent;
  AssertHelper local_9e0;
  Message local_9d8;
  _Self local_9d0;
  allocator<char> local_9c1;
  key_type local_9c0;
  _Self local_9a0;
  bool local_991;
  undefined1 local_990 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_960;
  Message local_958;
  _Self local_950;
  allocator<char> local_941;
  key_type local_940;
  _Self local_920;
  bool local_911;
  undefined1 local_910 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_8e0;
  Message local_8d8;
  _Self local_8d0;
  allocator<char> local_8c1;
  key_type local_8c0;
  _Self local_8a0;
  bool local_891;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  shared_ptr<kratos::Attribute> attr;
  shared_ptr<kratos::Stmt> local_830;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  shared_ptr<kratos::IfStmt> if_2;
  shared_ptr<kratos::Stmt> local_7c0;
  undefined1 local_7b0 [8];
  shared_ptr<kratos::IfStmt> if_seq_child_1;
  EventEdgeType local_78c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_788;
  undefined1 local_770 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq_child_1;
  string local_758;
  undefined1 local_738 [8];
  Port *flush;
  string local_728;
  element_type *local_708;
  Var *c_child_1;
  string local_6f8;
  __node_base local_6d8;
  Var *b_child_1;
  string local_6c8;
  __node_base local_6a8;
  Var *a_child_1;
  string local_698;
  Port *local_678;
  Port *rst_child2;
  string local_668;
  undefined8 local_648;
  Port *clk_child2;
  string local_638;
  allocator<char> local_611;
  string local_610;
  Generator *local_5f0;
  Generator *child2;
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [32];
  undefined1 local_598 [8];
  shared_ptr<kratos::IfStmt> if_seq_child;
  EventEdgeType local_574;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_570;
  undefined1 local_558 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq_child;
  string local_540;
  undefined1 local_520 [8];
  Var *c_child;
  string local_510;
  __node_base local_4f0;
  Var *b_child;
  string local_4e0;
  Var *local_4c0;
  Var *a_child;
  string local_4b0;
  __node_base local_490;
  Port *rst_child;
  string local_480;
  Port *local_460;
  Port *clk_child;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  Generator *local_3f8;
  Generator *child;
  shared_ptr<kratos::Stmt> local_3e0;
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [8];
  shared_ptr<kratos::IfStmt> if_clk_en;
  shared_ptr<kratos::Stmt> local_390;
  undefined1 local_380 [8];
  shared_ptr<kratos::IfStmt> if_seq_parent_1;
  EventEdgeType local_35c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_358;
  undefined1 local_340 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq_parent_1;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  shared_ptr<kratos::IfStmt> if_seq_parent;
  EventEdgeType local_2bc;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_2b8;
  undefined1 local_2a0 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq_parent;
  string local_288;
  undefined1 local_268 [8];
  Var *c_;
  string local_258;
  __node_base local_238;
  Var *b;
  string local_228;
  Port *local_208;
  Port *a;
  string local_1f8;
  undefined8 local_1d8;
  Port *clk_en;
  string local_1c8;
  undefined8 local_1a8;
  Port *rst;
  string local_198;
  Port *local_178;
  Port *clk;
  allocator<char> local_159;
  string local_158;
  __node_base local_138;
  Generator *parent;
  Context c;
  pass_insert_sync_reset_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&parent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"parent",&local_159);
  pGVar5 = kratos::Context::generator((Context *)&parent,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138._M_nxt = (_Hash_node_base *)pGVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"clk",(allocator<char> *)((long)&rst + 7));
  pPVar6 = kratos::Generator::port(pGVar5,In,&local_198,1,Clock);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rst + 7));
  _Var3._M_nxt = local_138._M_nxt;
  local_178 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"rst",(allocator<char> *)((long)&clk_en + 7));
  pPVar6 = kratos::Generator::port((Generator *)_Var3._M_nxt,In,&local_1c8,1,AsyncReset);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_en + 7));
  _Var3._M_nxt = local_138._M_nxt;
  local_1a8 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"clk_en",(allocator<char> *)((long)&a + 7));
  pPVar6 = kratos::Generator::port((Generator *)_Var3._M_nxt,In,&local_1f8,1,ClockEnable);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
  _Var3._M_nxt = local_138._M_nxt;
  local_1d8 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"a",(allocator<char> *)((long)&b + 7));
  pPVar6 = kratos::Generator::port((Generator *)_Var3._M_nxt,Out,&local_228,1);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  _Var3._M_nxt = local_138._M_nxt;
  local_208 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"b",(allocator<char> *)((long)&c_ + 7));
  peVar7 = (element_type *)kratos::Generator::var((Generator *)_Var3._M_nxt,&local_258,1);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c_ + 7));
  _Var3._M_nxt = local_138._M_nxt;
  local_238._M_nxt = (_Hash_node_base *)peVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"c",
             (allocator<char> *)
             ((long)&seq_parent.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pVVar8 = kratos::Generator::var((Generator *)_Var3._M_nxt,&local_288,1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&seq_parent.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_268 = (undefined1  [8])pVVar8;
  kratos::Generator::sequential((Generator *)local_2a0);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2a0);
  local_2bc = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_seq_parent.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_2b8,&local_2bc,
             (shared_ptr<kratos::Var> *)
             &if_seq_parent.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar9,&local_2b8);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_2b8);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_seq_parent.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_2e0);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_2e0);
  _Var2._M_nxt = local_238._M_nxt;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)local_300,(Var *)_Var2._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_300 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_300);
  kratos::IfStmt::add_then_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_300 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_300 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_300);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_2e0);
  kratos::Var::assign((Var *)local_320,(Var *)local_268);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_320 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_320);
  kratos::IfStmt::add_else_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_320 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_320 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_320);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2a0);
  p_Var1 = &seq_parent_1.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)p_Var1,(shared_ptr<kratos::IfStmt> *)local_2e0);
  kratos::StmtBlock::add_stmt(&peVar9->super_StmtBlock,(shared_ptr<kratos::Stmt> *)p_Var1);
  std::shared_ptr<kratos::Stmt>::~shared_ptr
            ((shared_ptr<kratos::Stmt> *)
             &seq_parent_1.
              super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_2e0);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_2a0);
  kratos::Generator::sequential((Generator *)local_340);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_340);
  local_35c = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_seq_parent_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_358,&local_35c,
             (shared_ptr<kratos::Var> *)
             &if_seq_parent_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar9,&local_358);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_358);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_seq_parent_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_380);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_380);
  _Var2._M_nxt = local_238._M_nxt;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)&if_clk_en.
                              super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(Var *)_Var2._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_390,
             (shared_ptr<kratos::AssignStmt> *)
             &if_clk_en.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::IfStmt::add_then_stmt(peVar10,&local_390);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_390);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)
             &if_clk_en.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_3b0);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_3b0);
  kratos::Var::assign((Var *)local_3d0,(Var *)local_268);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3d0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_3d0);
  kratos::IfStmt::add_then_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_3d0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3d0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3d0);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_380);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            (&local_3e0,(shared_ptr<kratos::IfStmt> *)local_3b0);
  kratos::IfStmt::add_else_stmt(peVar10,&local_3e0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_3e0);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_340);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)&child,(shared_ptr<kratos::IfStmt> *)local_380);
  kratos::StmtBlock::add_stmt(&peVar9->super_StmtBlock,(shared_ptr<kratos::Stmt> *)&child);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&child);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_3b0);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_380);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"child",&local_419);
  pGVar5 = kratos::Context::generator((Context *)&parent,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  _Var3._M_nxt = local_138._M_nxt;
  local_3f8 = pGVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"child",&local_441);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this
            ((enable_shared_from_this<kratos::Generator> *)&clk_child);
  kratos::Generator::add_child_generator
            ((Generator *)_Var3._M_nxt,&local_440,(shared_ptr<kratos::Generator> *)&clk_child);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&clk_child);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  pGVar5 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"clk",(allocator<char> *)((long)&rst_child + 7));
  pPVar6 = kratos::Generator::port(pGVar5,In,&local_480,1,Clock);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rst_child + 7));
  pGVar5 = local_3f8;
  local_460 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"rst",(allocator<char> *)((long)&a_child + 7));
  pPVar6 = kratos::Generator::port(pGVar5,In,&local_4b0,1,AsyncReset);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a_child + 7));
  local_490._M_nxt = (_Hash_node_base *)pPVar6;
  kratos::Generator::wire((Generator *)local_138._M_nxt,&local_460->super_Var,&local_178->super_Var)
  ;
  kratos::Generator::wire((Generator *)local_138._M_nxt,(Var *)local_490._M_nxt,(Var *)local_1a8);
  pGVar5 = local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"a",(allocator<char> *)((long)&b_child + 7));
  pVVar8 = kratos::Generator::var(pGVar5,&local_4e0,1);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b_child + 7));
  pGVar5 = local_3f8;
  local_4c0 = pVVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"b",(allocator<char> *)((long)&c_child + 7));
  peVar7 = (element_type *)kratos::Generator::var(pGVar5,&local_510,1);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c_child + 7));
  pGVar5 = local_3f8;
  local_4f0._M_nxt = (_Hash_node_base *)peVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"c",
             (allocator<char> *)
             ((long)&seq_child.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pVVar8 = kratos::Generator::var(pGVar5,&local_540,1);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&seq_child.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_520 = (undefined1  [8])pVVar8;
  kratos::Generator::sequential((Generator *)local_558);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_558);
  local_574 = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_seq_child.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_570,&local_574,
             (shared_ptr<kratos::Var> *)
             &if_seq_child.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar9,&local_570);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_570);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_seq_child.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_598);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_598);
  _Var2._M_nxt = local_4f0._M_nxt;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)local_5b8,(Var *)_Var2._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_5b8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_5b8);
  kratos::IfStmt::add_then_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_5b8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_5b8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_5b8);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_598);
  kratos::Var::assign((Var *)local_5d8,(Var *)local_520);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_5d8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_5d8);
  kratos::IfStmt::add_else_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_5d8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_5d8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_5d8);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_558);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)&child2,(shared_ptr<kratos::IfStmt> *)local_598);
  kratos::StmtBlock::add_stmt(&peVar9->super_StmtBlock,(shared_ptr<kratos::Stmt> *)&child2);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&child2);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_598);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_610,"child2",&local_611);
  pGVar5 = kratos::Context::generator((Context *)&parent,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  _Var3._M_nxt = local_138._M_nxt;
  local_5f0 = pGVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"child2",(allocator<char> *)((long)&clk_child2 + 7));
  kratos::Generator::add_child_generator((Generator *)_Var3._M_nxt,&local_638,local_5f0);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_child2 + 7));
  pGVar5 = local_5f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"clk",(allocator<char> *)((long)&rst_child2 + 7));
  pPVar6 = kratos::Generator::port(pGVar5,In,&local_668,1,Clock);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rst_child2 + 7));
  pGVar5 = local_5f0;
  local_648 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"rst",(allocator<char> *)((long)&a_child_1 + 7));
  pPVar6 = kratos::Generator::port(pGVar5,In,&local_698,1,AsyncReset);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a_child_1 + 7));
  local_678 = pPVar6;
  kratos::Generator::wire((Generator *)local_138._M_nxt,(Var *)local_648,&local_178->super_Var);
  kratos::Generator::wire((Generator *)local_138._M_nxt,&local_678->super_Var,(Var *)local_1a8);
  pGVar5 = local_5f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"a",(allocator<char> *)((long)&b_child_1 + 7));
  pVVar8 = kratos::Generator::var(pGVar5,&local_6c8,1);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b_child_1 + 7));
  pGVar5 = local_5f0;
  local_6a8._M_nxt = (_Hash_node_base *)pVVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"b",(allocator<char> *)((long)&c_child_1 + 7));
  pVVar8 = kratos::Generator::var(pGVar5,&local_6f8,1);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c_child_1 + 7));
  pGVar5 = local_5f0;
  local_6d8._M_nxt = (_Hash_node_base *)pVVar8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"c",(allocator<char> *)((long)&flush + 7));
  peVar7 = (element_type *)kratos::Generator::var(pGVar5,&local_728,1);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)((long)&flush + 7));
  pGVar5 = local_5f0;
  local_708 = peVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"flush",
             (allocator<char> *)
             ((long)&seq_child_1.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pPVar6 = kratos::Generator::port(pGVar5,In,&local_758,1,Reset);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&seq_child_1.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  _Var3._M_nxt = local_138._M_nxt;
  local_738 = (undefined1  [8])pPVar6;
  right = kratos::constant(1,1,false);
  kratos::Generator::wire((Generator *)_Var3._M_nxt,&pPVar6->super_Var,&right->super_Var);
  kratos::Generator::sequential((Generator *)local_770);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_770);
  local_78c = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_seq_child_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_788,&local_78c,
             (shared_ptr<kratos::Var> *)
             &if_seq_child_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar9,&local_788);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_788);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_seq_child_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_7b0);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_7b0);
  var._M_nxt = local_6d8._M_nxt;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)&if_2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(Var *)var._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_7c0,
             (shared_ptr<kratos::AssignStmt> *)
             &if_2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::IfStmt::add_then_stmt(peVar10,&local_7c0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_7c0);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)
             &if_2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_7e0);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_7e0);
  peVar7 = local_708;
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_800,(Var *)peVar7);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_800 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_800);
  kratos::IfStmt::add_then_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_800 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_800 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_800);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_7e0);
  kratos::Var::assign((Var *)local_820,(Var *)local_708);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_820 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_820);
  kratos::IfStmt::add_else_stmt(peVar10,(shared_ptr<kratos::Stmt> *)(local_820 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_820 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_820);
  peVar10 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_7b0);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            (&local_830,(shared_ptr<kratos::IfStmt> *)local_7e0);
  kratos::IfStmt::add_else_stmt(peVar10,&local_830);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_830);
  peVar9 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_770);
  p_Var1 = &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)p_Var1,(shared_ptr<kratos::IfStmt> *)local_7b0);
  kratos::StmtBlock::add_stmt(&peVar9->super_StmtBlock,(shared_ptr<kratos::Stmt> *)p_Var1);
  std::shared_ptr<kratos::Stmt>::~shared_ptr
            ((shared_ptr<kratos::Stmt> *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_7e0);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_7b0);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_770);
  std::make_shared<kratos::Attribute>();
  peVar11 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::operator=
            ((string *)&peVar11->value_str,"sync-reset=flush;over_clk_en=false");
  kratos::IRNode::add_attribute
            ((IRNode *)local_138._M_nxt,
             (shared_ptr<kratos::Attribute> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  kratos::auto_insert_sync_reset((Generator *)local_138._M_nxt);
  kratos::fix_assignment_type((Generator *)local_138._M_nxt);
  kratos::create_module_instantiation((Generator *)local_138._M_nxt);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_,(kratos *)local_138._M_nxt,top);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"parent",&local_8c1);
  local_8a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_8c0);
  local_8d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_891 = std::operator!=(&local_8a0,&local_8d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_890,&local_891,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar4) {
    testing::Message::Message(&local_8d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_890,
               (AssertionResult *)"src.find(\"parent\") != src.end()","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x142,pcVar12);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"child",&local_941);
  local_920._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_940);
  local_950._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_911 = std::operator!=(&local_920,&local_950);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_910,&local_911,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar4) {
    testing::Message::Message(&local_958);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_910,
               (AssertionResult *)"src.find(\"child\") != src.end()","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x143,pcVar12);
    testing::internal::AssertHelper::operator=(&local_960,&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c0,"child2",&local_9c1);
  local_9a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_9c0);
  local_9d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_991 = std::operator!=(&local_9a0,&local_9d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_990,&local_991,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::allocator<char>::~allocator(&local_9c1);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar4) {
    testing::Message::Message(&local_9d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_parent.field_2 + 8),(internal *)local_990,
               (AssertionResult *)"src.find(\"child2\") != src.end()","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x144,pcVar12);
    testing::internal::AssertHelper::operator=(&local_9e0,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9e0);
    std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"parent",
             (allocator<char> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_.message_,&local_a40);
  std::__cxx11::string::string(local_a20,(string *)pmVar13);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lVar14 = std::__cxx11::string::find((char *)local_a20,0x43057c);
  local_a59 = lVar14 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a58,&local_a59,(type *)0x0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar4) {
    testing::Message::Message(&local_a68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_a58,
               (AssertionResult *)
               "src_parent.find(\"else if (flush) begin\\n\" \"    b <= 1\'h0;\\n\" \"  end\") != std::string::npos"
               ,"false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x148,pcVar12);
    testing::internal::AssertHelper::operator=(&local_a70,&local_a68);
    testing::internal::AssertHelper::~AssertHelper(&local_a70);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  lVar14 = std::__cxx11::string::find((char *)local_a20,0x430602);
  local_aa1 = lVar14 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_aa0,&local_aa1,(type *)0x0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar4) {
    testing::Message::Message(&local_ab0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_child.field_2 + 8),(internal *)local_aa0,
               (AssertionResult *)
               "src_parent.find(\"child2 child2 (\\n\" \"  .clk(clk),\\n\" \"  .flush(flush),\") != std::string::npos"
               ,"false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x14b,pcVar12);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    std::__cxx11::string::~string((string *)(src_child.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b18,"child",
             (allocator<char> *)
             ((long)&gtest_ar__5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_.message_,&local_b18);
  std::__cxx11::string::string(local_af8,(string *)pmVar13);
  std::__cxx11::string::~string((string *)&local_b18);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lVar14 = std::__cxx11::string::find((char *)local_af8,0x43068e);
  local_b31 = lVar14 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b30,&local_b31,(type *)0x0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
  if (!bVar4) {
    testing::Message::Message(&local_b40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_child2.field_2 + 8),(internal *)local_b30,
               (AssertionResult *)
               "src_child.find(\"else if (flush) begin\\n\" \"    b <= 1\'h0;\") != std::string::npos"
               ,"false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x14e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b48,&local_b40);
    testing::internal::AssertHelper::~AssertHelper(&local_b48);
    std::__cxx11::string::~string((string *)(src_child2.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_b40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba8,"child2",
             (allocator<char> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_.message_,&local_ba8);
  std::__cxx11::string::string(local_b88,(string *)pmVar13);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lVar14 = std::__cxx11::string::find((char *)local_b88,0x430703);
  local_bc1 = lVar14 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bc0,&local_bc1,(type *)0x0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
  if (!bVar4) {
    testing::Message::Message(&local_bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bf8,(internal *)local_bc0,
               (AssertionResult *)
               "src_child2.find(\"else if (flush) begin\\n\" \"    c <= 1\'h1;\") != std::string::npos"
               ,"false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x151,pcVar12);
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    std::__cxx11::string::~string((string *)&local_bf8);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
  std::__cxx11::string::~string(local_b88);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_a20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&gtest_ar_.message_);
  std::shared_ptr<kratos::Attribute>::~shared_ptr
            ((shared_ptr<kratos::Attribute> *)&src._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  kratos::Context::~Context((Context *)&parent);
  return;
}

Assistant:

TEST(pass, insert_sync_reset) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto &a = parent.port(PortDirection::Out, "a", 1);
    auto &b = parent.var("b", 1);
    auto &c_ = parent.var("c", 1);

    // this is the one with reset logic
    {
        auto seq_parent = parent.sequential();
        seq_parent->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
        auto if_seq_parent = std::make_shared<IfStmt>(rst);
        if_seq_parent->add_then_stmt(b.assign(constant(0, 1)));
        if_seq_parent->add_else_stmt(c_.assign(a));
        seq_parent->add_stmt(if_seq_parent);
    }

    // this is the one with both reset and clock enable
    {
        auto seq_parent = parent.sequential();
        seq_parent->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
        auto if_seq_parent = std::make_shared<IfStmt>(rst);
        if_seq_parent->add_then_stmt(b.assign(constant(0, 1)));
        auto if_clk_en = std::make_shared<IfStmt>(clk_en);
        if_clk_en->add_then_stmt(c_.assign(a));
        if_seq_parent->add_else_stmt(if_clk_en);
        seq_parent->add_stmt(if_seq_parent);
    }

    // test child wiring
    auto &child = c.generator("child");
    parent.add_child_generator("child", child.shared_from_this());
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst_child = child.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    parent.wire(clk_child, clk);
    parent.wire(rst_child, rst);
    {
        auto &a_child = child.var("a", 1);
        auto &b_child = child.var("b", 1);
        auto &c_child = child.var("c", 1);
        auto seq_child = child.sequential();
        seq_child->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
        // same thing as the parent
        auto if_seq_child = std::make_shared<IfStmt>(rst_child);
        if_seq_child->add_then_stmt(b_child.assign(constant(0, 1)));
        if_seq_child->add_else_stmt(c_child.assign(a_child));
        seq_child->add_stmt(if_seq_child);
    }

    // this child already has it's own flush logic
    auto &child2 = c.generator("child2");
    parent.add_child_generator("child2", child2);
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst_child2 = child2.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    parent.wire(clk_child2, clk);
    parent.wire(rst_child2, rst);
    {
        auto &a_child = child2.var("a", 1);
        auto &b_child = child2.var("b", 1);
        auto &c_child = child2.var("c", 1);
        auto &flush = child2.port(PortDirection::In, "flush", 1, PortType::Reset);
        parent.wire(flush, constant(1, 1));
        auto seq_child = child2.sequential();
        seq_child->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
        // same thing as the parent
        auto if_seq_child = std::make_shared<IfStmt>(rst_child2);
        if_seq_child->add_then_stmt(b_child.assign(constant(0, 1)));
        auto if_2 = std::make_shared<IfStmt>(flush);
        if_2->add_then_stmt(c_child.assign(constant(1, 1)));
        if_2->add_else_stmt(c_child.assign(a_child));
        if_seq_child->add_else_stmt(if_2);
        seq_child->add_stmt(if_seq_child);
    }

    // add attribute
    auto attr = std::make_shared<Attribute>();
    attr->value_str = "sync-reset=flush;over_clk_en=false";
    parent.add_attribute(attr);
    auto_insert_sync_reset(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);

    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    auto src_parent = src.at("parent");
    EXPECT_TRUE(src_parent.find("else if (flush) begin\n"
                                "    b <= 1'h0;\n"
                                "  end") != std::string::npos);
    EXPECT_TRUE(src_parent.find("child2 child2 (\n"
                                "  .clk(clk),\n"
                                "  .flush(flush),") != std::string::npos);
    auto src_child = src.at("child");
    EXPECT_TRUE(src_child.find("else if (flush) begin\n"
                               "    b <= 1'h0;") != std::string::npos);
    auto src_child2 = src.at("child2");
    EXPECT_TRUE(src_child2.find("else if (flush) begin\n"
                                "    c <= 1'h1;") != std::string::npos);
}